

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

_Bool chck_buffer_from_pointer(chck_buffer *buf,void *ptr,size_t size,chck_endianess endianess)

{
  undefined1 local_50 [24];
  undefined8 local_38;
  chck_endianess local_24;
  size_t sStack_20;
  chck_endianess endianess_local;
  size_t size_local;
  void *ptr_local;
  chck_buffer *buf_local;
  
  local_24 = endianess;
  sStack_20 = size;
  size_local = (size_t)ptr;
  ptr_local = buf;
  if (buf != (chck_buffer *)0x0) {
    memset(local_50,0,0x28);
    local_38 = 0x20;
    memcpy(buf,local_50,0x28);
    chck_buffer_set_pointer((chck_buffer *)ptr_local,(void *)size_local,sStack_20,local_24);
    return true;
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x62,
                "_Bool chck_buffer_from_pointer(struct chck_buffer *, void *, size_t, enum chck_endianess)"
               );
}

Assistant:

bool
chck_buffer_from_pointer(struct chck_buffer *buf, void *ptr, size_t size, enum chck_endianess endianess)
{
   assert(buf);
   *buf = (struct chck_buffer){ .step = 32 };
   chck_buffer_set_pointer(buf, ptr, size, endianess);
   return true;
}